

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::preDraw
          (SampleMaskUniqueSetCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  MessageBuilder local_1a0;
  undefined4 local_1c;
  long lStack_18;
  int selectorLoc;
  Functions *gl;
  SampleMaskUniqueSetCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lStack_18 + 0xb48);
  dVar3 = glu::ShaderProgram::getProgram
                    ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                     super_MultisampleRenderCase.m_program);
  local_1c = (*pcVar1)(dVar3,"u_bitSelector");
  (**(code **)(lStack_18 + 0x1500))
            (local_1c,(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.m_iteration);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"set u_bitSelector",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                  ,0x6a1);
  this_00 = tcu::TestContext::getLog
                      ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                       super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [25])"Setting u_bitSelector = ");
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,&(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                              super_MultisampleRenderCase.m_iteration);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  SampleMaskBaseCase::preDraw(&this->super_SampleMaskBaseCase);
  return;
}

Assistant:

void SampleMaskUniqueSetCase::preDraw (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				selectorLoc	= gl.getUniformLocation(m_program->getProgram(), "u_bitSelector");

	gl.uniform1ui(selectorLoc, (deUint32)m_iteration);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set u_bitSelector");

	m_testCtx.getLog() << tcu::TestLog::Message << "Setting u_bitSelector = " << m_iteration << tcu::TestLog::EndMessage;

	SampleMaskBaseCase::preDraw();
}